

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O3

void __thiscall tvm::runtime::WorkspacePool::Pool::Pool(Pool *this)

{
  pointer *ppEVar1;
  iterator __position;
  Entry local_38;
  
  (this->allocated_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allocated_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->free_list_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocated_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->free_list_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->free_list_).
  super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.data = (void *)0x0;
  local_38.size = 0;
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
  ::_M_realloc_insert<tvm::runtime::WorkspacePool::Pool::Entry_const&>
            ((vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
              *)this,(iterator)0x0,&local_38);
  __position._M_current =
       (this->allocated_).
       super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->allocated_).
      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
    ::_M_realloc_insert<tvm::runtime::WorkspacePool::Pool::Entry_const&>
              ((vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>
                *)&this->allocated_,__position,&local_38);
  }
  else {
    (__position._M_current)->data = local_38.data;
    (__position._M_current)->size = local_38.size;
    ppEVar1 = &(this->allocated_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return;
}

Assistant:

Pool() {
    // safe guard header on each list.
    Entry e;
    e.data = nullptr;
    e.size = 0;
    free_list_.push_back(e);
    allocated_.push_back(e);
  }